

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

short __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,short,duckdb::QuantileIndirect<short>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<short> *accessor)

{
  DataChunk *result_00;
  short input;
  CURSOR *pCVar1;
  bool bVar2;
  reference pvVar3;
  unkbyte10 Var4;
  short result_1;
  short local_42;
  string local_40;
  
  pCVar1 = accessor->data;
  if (((pCVar1->scan).next_row_index <= lidx) || (lidx < (pCVar1->scan).current_row_index)) {
    result_00 = &pCVar1->page;
    ColumnDataCollection::Seek(pCVar1->inputs,lidx,&pCVar1->scan,result_00);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    pCVar1->data = (short *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar1->validity = &pvVar3->validity;
  }
  input = pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)];
  bVar2 = TryCast::Operation<short,short>(input,&local_42,false);
  if (bVar2) {
    return local_42;
  }
  Var4 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,short>
            (&local_40,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var4 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var4,(string *)&local_40);
  __cxa_throw((InvalidInputException *)Var4,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}